

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall Piece::Piece(Piece *this)

{
  PieceSquareTableInterpolating local_168;
  Piece *local_10;
  Piece *this_local;
  
  this->_vptr_Piece = (_func_int **)&PTR___cxa_pure_virtual_0014f148;
  local_10 = this;
  PieceSquareTableInterpolating::PieceSquareTableInterpolating(&this->m_PieceSquareTable);
  this->m_Color = false;
  this->m_PieceType = NONE;
  this->m_pOtherColor = (Piece *)0x0;
  PieceSquareTableInterpolating::PieceSquareTableInterpolating(&local_168,&psrtDefault,0.0);
  PieceSquareTableInterpolating::operator=(&this->m_PieceSquareTable,&local_168);
  PieceSquareTableInterpolating::~PieceSquareTableInterpolating(&local_168);
  return;
}

Assistant:

Piece()
    {
        m_Color = BLACK;
        m_PieceType = NONE;
        m_pOtherColor = NULL;
        m_PieceSquareTable = psrtDefault;
    }